

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int demo(void)

{
  int iVar1;
  ostream *poVar2;
  char *result;
  MyParser *this;
  pointer piVar3;
  pointer pfVar4;
  float f_num;
  int num;
  Parse test;
  vector<float,_std::allocator<float>_> float_vec;
  vector<int,_std::allocator<int>_> int_vec;
  string str_a;
  string line_1;
  
  parse::Parse::Parse(&test);
  std::__cxx11::string::string
            ((string *)&line_1,"xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33",
             (allocator *)&str_a);
  parse::Parse::parse_line(&test,&line_1);
  num = 0;
  parse::Parse::get_column<int>(&test,1,&num);
  poVar2 = std::operator<<((ostream *)&std::cout,"int format: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,num);
  std::endl<char,std::char_traits<char>>(poVar2);
  f_num = 0.0;
  parse::Parse::get_column<float>(&test,2,&f_num);
  poVar2 = std::operator<<((ostream *)&std::cout,"float format: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,f_num);
  std::endl<char,std::char_traits<char>>(poVar2);
  result = (char *)operator_new__(3);
  parse::Parse::get_column<char>(&test,3,result);
  poVar2 = std::operator<<((ostream *)&std::cout,"char* format: ");
  poVar2 = std::operator<<(poVar2,result);
  std::endl<char,std::char_traits<char>>(poVar2);
  str_a._M_dataplus._M_p = (pointer)&str_a.field_2;
  str_a._M_string_length = 0;
  str_a.field_2._M_local_buf[0] = '\0';
  parse::Parse::get_column<std::__cxx11::string>(&test,3,&str_a);
  poVar2 = std::operator<<((ostream *)&std::cout,"string format: ");
  poVar2 = std::operator<<(poVar2,(string *)&str_a);
  std::endl<char,std::char_traits<char>>(poVar2);
  int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  parse::Parse::get_column<std::vector<int,std::allocator<int>>>(&test,5,&int_vec);
  poVar2 = std::operator<<((ostream *)&std::cout,"int array format: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (piVar3 = int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 != int_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*piVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  float_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  float_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  float_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  parse::Parse::get_column<std::vector<float,std::allocator<float>>>(&test,5,&float_vec);
  poVar2 = std::operator<<((ostream *)&std::cout,"float array format: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (pfVar4 = float_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar4 != float_vec.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar4 = pfVar4 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*pfVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this = (MyParser *)operator_new(0x10);
  parse::MyParser::MyParser(this);
  parse::Parse::get_column<parse::UserStructInterface>(&test,7,(UserStructInterface *)this);
  iVar1 = parse::MyParser::get_data(this);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&float_vec.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&int_vec.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&str_a);
  std::__cxx11::string::~string((string *)&line_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&test._columns);
  return 0;
}

Assistant:

int demo(){
    parse::Parse test = parse::Parse();
    std::string line_1 = "xxxxx\t22\t3.3\tss\tsss\t3:2222,3333,44444\t3:2.0,3.0,4.0\t33";
    test.parse_line(line_1);

    int num = 0;
    test.get_column(1, &num);
    std::cout << "int format: " << num << std::endl;

    float f_num = 0.0;
    test.get_column(2, &f_num);
    std::cout << "float format: "  << f_num << std::endl;

    char *a = new char[3];
    test.get_column(3, a);
    std::cout << "char* format: " << a << std::endl;

    std::string str_a;
    test.get_column(3, &str_a);
    std::cout << "string format: " << str_a << std::endl;

    std::vector<int> int_vec;
    test.get_column(5, &int_vec);
    std::cout << "int array format: " << std::endl;
    for (std::vector<int>::const_iterator iter = int_vec.begin();
        iter != int_vec.end(); iter++){
        std::cout << *iter << std::endl;
    }

    std::vector<float> float_vec;
    test.get_column(5, &float_vec);
    std::cout << "float array format: " << std::endl;
    for (std::vector<float>::const_iterator iter = float_vec.begin();
        iter != float_vec.end(); iter++){
        std::cout << *iter << std::endl;
    }

    parse::UserStructInterface *my_struct = new parse::MyParser();
    test.get_column(7, my_struct);
    int my_struct_a = ((parse::MyParser*)my_struct)->get_data();
    std::cout << my_struct_a << std::endl;

    return 0;
}